

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void ARGBToRGB565Row_C(uint8_t *src_argb,uint8_t *dst_rgb,int width)

{
  int iVar1;
  
  if (1 < width) {
    iVar1 = 0;
    do {
      *(uint *)dst_rgb =
           (src_argb[6] & 0xfffffff8) << 0x18 |
           (src_argb[5] & 0xfc) << 0x13 |
           (src_argb[4] & 0xf8) << 0xd |
           (src_argb[2] & 0xf8) << 8 | (uint)(*src_argb >> 3) + (src_argb[1] & 0xfc) * 8;
      dst_rgb = (uint8_t *)((long)dst_rgb + 4);
      src_argb = src_argb + 8;
      iVar1 = iVar1 + 2;
    } while (iVar1 < width + -1);
  }
  if ((width & 1U) != 0) {
    *(ushort *)dst_rgb =
         (src_argb[2] & 0xfff8) << 8 | (ushort)(*src_argb >> 3) + (src_argb[1] & 0xfc) * 8;
  }
  return;
}

Assistant:

void ARGBToRGB565Row_C(const uint8_t* src_argb, uint8_t* dst_rgb, int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8_t b0 = src_argb[0] >> 3;
    uint8_t g0 = src_argb[1] >> 2;
    uint8_t r0 = src_argb[2] >> 3;
    uint8_t b1 = src_argb[4] >> 3;
    uint8_t g1 = src_argb[5] >> 2;
    uint8_t r1 = src_argb[6] >> 3;
    WRITEWORD(dst_rgb, b0 | (g0 << 5) | (r0 << 11) | (b1 << 16) | (g1 << 21) |
                           (r1 << 27));
    dst_rgb += 4;
    src_argb += 8;
  }
  if (width & 1) {
    uint8_t b0 = src_argb[0] >> 3;
    uint8_t g0 = src_argb[1] >> 2;
    uint8_t r0 = src_argb[2] >> 3;
    *(uint16_t*)(dst_rgb) = b0 | (g0 << 5) | (r0 << 11);
  }
}